

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void * lws_protocol_vh_priv_get(lws_vhost *vhost,lws_protocols *prot)

{
  int iVar1;
  lws_log_cx *cx;
  bool bVar2;
  int local_24;
  int n;
  lws_protocols *prot_local;
  lws_vhost *vhost_local;
  
  local_24 = 0;
  if ((((vhost == (lws_vhost *)0x0) || (vhost->protocols == (lws_protocols *)0x0)) ||
      (vhost->protocol_vh_privs == (void **)0x0)) ||
     ((prot == (lws_protocols *)0x0 || (prot->name == (char *)0x0)))) {
    vhost_local = (lws_vhost *)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (local_24 < vhost->count_protocols) {
        bVar2 = vhost->protocols + local_24 != prot;
      }
      if (!bVar2) break;
      local_24 = local_24 + 1;
    }
    if (local_24 == vhost->count_protocols) {
      local_24 = 0;
      while ((local_24 < vhost->count_protocols &&
             ((vhost->protocols[local_24].name == (char *)0x0 ||
              (iVar1 = strcmp(vhost->protocols[local_24].name,prot->name), iVar1 != 0))))) {
        local_24 = local_24 + 1;
      }
      if (local_24 == vhost->count_protocols) {
        cx = lwsl_vhost_get_cx(vhost);
        _lws_log_cx(cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_get",
                    "unknown protocol %p",prot);
        return (void *)0x0;
      }
    }
    vhost_local = (lws_vhost *)vhost->protocol_vh_privs[local_24];
  }
  return vhost_local;
}

Assistant:

void *
lws_protocol_vh_priv_get(struct lws_vhost *vhost,
			 const struct lws_protocols *prot)
{
	int n = 0;

	if (!vhost || !vhost->protocols ||
	    !vhost->protocol_vh_privs || !prot || !prot->name)
		return NULL;

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	return vhost->protocol_vh_privs[n];
}